

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<__gnu_cxx::__normal_iterator<cinatra::http_header*,std::span<cinatra::http_header,18446744073709551615ul>>,__gnu_cxx::__normal_iterator<cinatra::http_header*,std::span<cinatra::http_header,18446744073709551615ul>>>
          (String *__return_storage_ptr__,detail *this,
          __normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
          *lhs,char *op,
          __normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
          *rhs)

{
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  String::String(&local_40,"{?}");
  String::String(&local_58,(char *)lhs);
  operator+(&local_28,&local_40,&local_58);
  String::String(&local_70,"{?}");
  operator+(__return_storage_ptr__,&local_28,&local_70);
  String::~String(&local_70);
  String::~String(&local_28);
  String::~String(&local_58);
  String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                                   const DOCTEST_REF_WRAP(R) rhs) {
            // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
            return toString(lhs) + op + toString(rhs);
        }